

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_StringDictionary.cpp
# Opt level: O0

Handle __thiscall
soul::StringDictionary::getHandleForString(StringDictionary *this,string_view text)

{
  basic_string_view<char,_std::char_traits<char>_> __y;
  bool bVar1;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __x;
  allocator<char> local_91;
  value_type local_90;
  StringDictionary *local_68;
  size_t local_60;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_58;
  reference local_48;
  Item *s;
  iterator __end1;
  iterator __begin1;
  vector<soul::StringDictionary::Item,_std::allocator<soul::StringDictionary::Item>_> *__range1;
  StringDictionary *this_local;
  string_view text_local;
  Handle handle;
  
  text_local._M_len = (size_t)text._M_str;
  this_local = (StringDictionary *)text._M_len;
  bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                    ((basic_string_view<char,_std::char_traits<char>_> *)&this_local);
  if (bVar1) {
    text_local._M_str._4_4_ = 0;
  }
  else {
    __end1 = std::
             vector<soul::StringDictionary::Item,_std::allocator<soul::StringDictionary::Item>_>::
             begin(&this->strings);
    s = (Item *)std::
                vector<soul::StringDictionary::Item,_std::allocator<soul::StringDictionary::Item>_>
                ::end(&this->strings);
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        (&__end1,(__normal_iterator<soul::StringDictionary::Item_*,_std::vector<soul::StringDictionary::Item,_std::allocator<soul::StringDictionary::Item>_>_>
                                  *)&s);
      if (!bVar1) break;
      local_48 = __gnu_cxx::
                 __normal_iterator<soul::StringDictionary::Item_*,_std::vector<soul::StringDictionary::Item,_std::allocator<soul::StringDictionary::Item>_>_>
                 ::operator*(&__end1);
      __x = (__type_identity_t<basic_string_view<char,_char_traits<char>_>_>)
            std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_48->text);
      local_68 = this_local;
      local_60 = text_local._M_len;
      __y._M_str = (char *)text_local._M_len;
      __y._M_len = (size_t)this_local;
      local_58 = __x;
      bVar1 = std::operator==(__x,__y);
      if (bVar1) {
        return (Handle)(local_48->handle).handle;
      }
      __gnu_cxx::
      __normal_iterator<soul::StringDictionary::Item_*,_std::vector<soul::StringDictionary::Item,_std::allocator<soul::StringDictionary::Item>_>_>
      ::operator++(&__end1);
    }
    local_90.handle.handle = this->nextIndex;
    this->nextIndex = local_90.handle.handle + 1;
    text_local._M_str._4_4_ = local_90.handle.handle;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
              ((string *)&local_90.text,
               (basic_string_view<char,_std::char_traits<char>_> *)&this_local,&local_91);
    std::vector<soul::StringDictionary::Item,_std::allocator<soul::StringDictionary::Item>_>::
    push_back(&this->strings,&local_90);
    Item::~Item(&local_90);
    std::allocator<char>::~allocator(&local_91);
  }
  return (Handle)text_local._M_str._4_4_;
}

Assistant:

StringDictionary::Handle StringDictionary::getHandleForString (std::string_view text)
    {
        if (text.empty())
            return {};

        for (auto& s : strings)
            if (s.text == text)
                return s.handle;

        auto handle = StringDictionary::Handle { nextIndex++ };
        strings.push_back ({ handle, std::string (text) });
        return handle;
    }